

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O2

int pcx_search_tile(uchar *data,int size)

{
  uint uVar1;
  int iVar2;
  t_tile *ptVar3;
  
  iVar2 = 0;
  if (((pass == 1) && (iVar2 = -1, tile_lablptr != (t_symbol *)0x0)) && (tile_lablptr->size == size)
     ) {
    uVar1 = crc_calc(data,size);
    ptVar3 = (t_tile *)(tile_tbl + (uVar1 & 0xff));
    do {
      ptVar3 = ptVar3->next;
      if (ptVar3 == (t_tile *)0x0) {
        return -1;
      }
    } while ((ptVar3->crc != uVar1) || (iVar2 = bcmp(ptVar3->data,data,(long)size), iVar2 != 0));
    iVar2 = ptVar3->index;
  }
  return iVar2;
}

Assistant:

int
pcx_search_tile(unsigned char *data, int size)
{
	struct t_tile *tile;
	unsigned int crc;

	/* do nothing in first passes */
	if (pass != LAST_PASS)
		return (0);

	/* quick check */
	if (tile_lablptr == NULL)
		return (-1);
	if (tile_lablptr->size != size)
		return (-1);

	/* calculate tile crc */
	crc  = crc_calc(data, size);
	tile = tile_tbl[crc & 0xFF];

	/* search tile */
	while (tile) {
		if (tile->crc == crc) {
			if (memcmp(tile->data, data, size) == 0)
				return(tile->index);
	 	}
		tile = tile->next;
	}

	/* not found */
	return (-1);
}